

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

int64_t CLI::detail::to_flag_value(string *val)

{
  byte bVar1;
  size_t sVar2;
  pointer pcVar3;
  __type _Var4;
  int iVar5;
  int *piVar6;
  longlong lVar7;
  char *loc_ptr;
  long *local_60;
  long local_58;
  undefined1 local_50;
  undefined7 uStack_4f;
  undefined8 uStack_48;
  long *local_40;
  long local_38;
  long local_30;
  undefined8 uStack_28;
  
  if ((to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_),
     iVar5 != 0)) {
    to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,"true","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  }
  if ((to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_ == '\0') &&
     (iVar5 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_),
     iVar5 != 0)) {
    to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_._M_dataplus._M_p =
         (pointer)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,"false","");
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
  }
  sVar2 = val->_M_string_length;
  if (sVar2 == to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_string_length) {
    if (sVar2 == 0) {
      return 1;
    }
    iVar5 = bcmp((val->_M_dataplus)._M_p,
                 to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_dataplus._M_p,sVar2);
    if (iVar5 == 0) {
      return 1;
    }
  }
  if (sVar2 == to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_._M_string_length) {
    if (sVar2 == 0) {
      return -1;
    }
    iVar5 = bcmp((val->_M_dataplus)._M_p,
                 to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_._M_dataplus._M_p,sVar2)
    ;
    if (iVar5 == 0) {
      return -1;
    }
  }
  pcVar3 = (val->_M_dataplus)._M_p;
  local_60 = (long *)&local_50;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar3,pcVar3 + sVar2);
  ::std::
  transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,CLI::detail::to_lower(std::__cxx11::string)::_lambda(char_const&)_1_>
            (local_60,(undefined1 *)((long)local_60 + local_58),local_60);
  if (local_60 == (long *)&local_50) {
    uStack_28 = uStack_48;
    local_40 = &local_30;
  }
  else {
    local_40 = local_60;
  }
  local_30 = CONCAT71(uStack_4f,local_50);
  local_38 = local_58;
  local_58 = 0;
  local_50 = 0;
  local_60 = (long *)&local_50;
  ::std::__cxx11::string::operator=((string *)val,(string *)&local_40);
  if (local_40 != &local_30) {
    operator_delete(local_40,local_30 + 1);
  }
  if (local_60 != (long *)&local_50) {
    operator_delete(local_60,CONCAT71(uStack_4f,local_50) + 1);
  }
  sVar2 = val->_M_string_length;
  if (sVar2 == 1) {
    bVar1 = *(val->_M_dataplus)._M_p;
    if ((byte)(bVar1 - 0x31) < 9) {
      return (ulong)bVar1 - 0x30;
    }
    lVar7 = -1;
    if (bVar1 < 0x66) {
      if (bVar1 == 0x2b) {
        return 1;
      }
      if (bVar1 == 0x2d) {
        return -1;
      }
      if (bVar1 == 0x30) {
        return -1;
      }
    }
    else if (bVar1 < 0x74) {
      if (bVar1 == 0x66) {
        return -1;
      }
      if (bVar1 == 0x6e) {
        return -1;
      }
    }
    else {
      if (bVar1 == 0x79) {
        return 1;
      }
      if (bVar1 == 0x74) {
        return 1;
      }
    }
    piVar6 = __errno_location();
  }
  else {
    if (sVar2 == to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_string_length) {
      if (sVar2 == 0) {
        return 1;
      }
      iVar5 = bcmp((val->_M_dataplus)._M_p,
                   to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_._M_dataplus._M_p,sVar2
                  );
      if (iVar5 == 0) {
        return 1;
      }
    }
    iVar5 = ::std::__cxx11::string::compare((char *)val);
    if (iVar5 == 0) {
      return 1;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)val);
    if (iVar5 == 0) {
      return 1;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)val);
    if (iVar5 == 0) {
      return 1;
    }
    _Var4 = ::std::operator==(val,&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
    if (_Var4) {
      return -1;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)val);
    if (iVar5 == 0) {
      return -1;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)val);
    if (iVar5 == 0) {
      return -1;
    }
    iVar5 = ::std::__cxx11::string::compare((char *)val);
    if (iVar5 == 0) {
      return -1;
    }
    local_40 = (long *)0x0;
    lVar7 = strtoll((val->_M_dataplus)._M_p,(char **)&local_40,0);
    if (local_40 == (long *)((val->_M_dataplus)._M_p + val->_M_string_length)) {
      return lVar7;
    }
    piVar6 = __errno_location();
    if (*piVar6 != 0) {
      return lVar7;
    }
  }
  *piVar6 = 0x16;
  return lVar7;
}

Assistant:

inline std::int64_t to_flag_value(std::string val) noexcept {
    static const std::string trueString("true");
    static const std::string falseString("false");
    if(val == trueString) {
        return 1;
    }
    if(val == falseString) {
        return -1;
    }
    val = detail::to_lower(val);
    std::int64_t ret = 0;
    if(val.size() == 1) {
        if(val[0] >= '1' && val[0] <= '9') {
            return (static_cast<std::int64_t>(val[0]) - '0');
        }
        switch(val[0]) {
        case '0':
        case 'f':
        case 'n':
        case '-':
            ret = -1;
            break;
        case 't':
        case 'y':
        case '+':
            ret = 1;
            break;
        default:
            errno = EINVAL;
            return -1;
        }
        return ret;
    }
    if(val == trueString || val == "on" || val == "yes" || val == "enable") {
        ret = 1;
    } else if(val == falseString || val == "off" || val == "no" || val == "disable") {
        ret = -1;
    } else {
        char *loc_ptr{nullptr};
        ret = std::strtoll(val.c_str(), &loc_ptr, 0);
        if(loc_ptr != (val.c_str() + val.size()) && errno == 0) {
            errno = EINVAL;
        }
    }
    return ret;
}